

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O0

void __thiscall LinearScan::InsertLoads(LinearScan *this,StackSym *sym,RegNum reg)

{
  code *pcVar1;
  Instr **this_00;
  bool bVar2;
  undefined4 *puVar3;
  Type_conflict node;
  Type *ppIVar4;
  Instr **instr;
  Iterator __iter;
  Lifetime *lifetime;
  RegNum reg_local;
  StackSym *sym_local;
  LinearScan *this_local;
  
  __iter.current = *(NodeBase **)&sym->scratch;
  _instr = SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>::GetIterator
                     ((SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount> *)
                      ((long)__iter.current + 0x30));
  while( true ) {
    if (__iter.list == (SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                         ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    this_00 = instr;
    node = SListNodeBase<Memory::ArenaAllocator>::Next
                     (&(__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
    bVar2 = SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>::IsHead
                      ((SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount> *)this_00,node);
    if (bVar2) break;
    SListNodeBase<Memory::ArenaAllocator>::Next
              (&(__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
    ppIVar4 = SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                        ((Iterator *)&instr);
    InsertLoad(this,*ppIVar4,sym,reg);
  }
  SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>::Clear
            ((SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount> *)(__iter.current + 6));
  return;
}

Assistant:

void
LinearScan::InsertLoads(StackSym *sym, RegNum reg)
{
    Lifetime *lifetime = sym->scratch.linearScan.lifetime;

    FOREACH_SLIST_ENTRY(IR::Instr *, instr, &lifetime->useList)
    {
        this->InsertLoad(instr, sym, reg);
    } NEXT_SLIST_ENTRY;

    lifetime->useList.Clear();
}